

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O1

void ecx_dcsync0(ecx_contextt *context,uint16 slave,boolean act,uint32 CyclTime,uint32 CyclShift)

{
  uint16 ADP;
  undefined7 in_register_00000011;
  undefined6 in_register_00000032;
  uint8 RA;
  uint8 h;
  int32 tc;
  undefined1 local_3e;
  undefined1 local_3d;
  uint32 local_3c;
  long local_38;
  long local_30;
  
  ADP = context->slavelist[CONCAT62(in_register_00000032,slave) & 0xffffffff].configadr;
  local_3e = 0;
  ecx_FPWR(context->port,ADP,0x981,1,&local_3e,2000);
  if ((int)CONCAT71(in_register_00000011,act) != 0) {
    local_3e = 3;
  }
  local_3d = 0;
  ecx_FPWR(context->port,ADP,0x980,1,&local_3d,2000);
  ecx_FPRD(context->port,ADP,0x910,8,&local_38,2000);
  if (CyclTime == 0) {
    local_30 = (ulong)CyclShift + local_38 + 100000000;
  }
  else {
    local_30 = ((ulong)CyclShift + (ulong)CyclTime + local_38 + 100000000) -
               (local_38 + 100000000) % (long)(ulong)CyclTime;
  }
  ecx_FPWR(context->port,ADP,0x990,8,&local_30,2000);
  local_3c = CyclTime;
  ecx_FPWR(context->port,ADP,0x9a0,4,&local_3c,2000);
  ecx_FPWR(context->port,ADP,0x981,1,&local_3e,2000);
  return;
}

Assistant:

void ecx_dcsync0(ecx_contextt *context, uint16 slave, boolean act, uint32 CyclTime, uint32 CyclShift)
{
   uint8 h, RA;
   uint16 wc, slaveh;
   int64 t, t1;
   int32 tc;

   slaveh = context->slavelist[slave].configadr;
   RA = 0;

   /* stop cyclic operation, ready for next trigger */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); 
   if (act)
   {
       RA = 1 + 2;    /* act cyclic operation and sync0, sync1 deactivated */
   }
   h = 0;
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCUC, sizeof(h), &h, EC_TIMEOUTRET); /* write access to ethercat */
   wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSYSTIME, sizeof(t1), &t1, EC_TIMEOUTRET); /* read local time of slave */
   t1 = etohll(t1);

   /* Calculate first trigger time, always a whole multiple of CyclTime rounded up
   plus the shifttime (can be negative)
   This insures best sychronisation between slaves, slaves with the same CyclTime
   will sync at the same moment (you can use CyclShift to shift the sync) */
   if (CyclTime > 0)
   {
       t = ((t1 + SyncDelay) / CyclTime) * CyclTime + CyclTime + CyclShift;
   }
   else
   {
      t = t1 + SyncDelay + CyclShift;
      /* first trigger at T1 + CyclTime + SyncDelay + CyclShift in ns */
   }
   t = htoell(t);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSTART0, sizeof(t), &t, EC_TIMEOUTRET); /* SYNC0 start time */
   tc = htoel(CyclTime);
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCCYCLE0, sizeof(tc), &tc, EC_TIMEOUTRET); /* SYNC0 cycle time */
   wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYNCACT, sizeof(RA), &RA, EC_TIMEOUTRET); /* activate cyclic operation */
}